

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInternalFormatQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::InternalFormatQueryTests::init
          (InternalFormatQueryTests *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  char *__s;
  Context *context;
  int extraout_EAX;
  long lVar2;
  ApiCase *pAVar3;
  allocator<char> local_89;
  ApiCase *local_88;
  undefined4 local_7c;
  long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = 0xc;
  while (lVar2 != 0x24c) {
    __s = *(char **)((long)&PTR_iterate_01e382e0 + lVar2 + 4);
    local_7c = *(undefined4 *)(&UNK_01e382ec + lVar2);
    bVar1 = *(byte *)((long)&DAT_01e382f0 + lVar2);
    local_78 = lVar2;
    local_88 = (ApiCase *)operator_new(0xa0);
    context = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_89);
    std::operator+(&local_70,&local_50,"_samples");
    pAVar3 = local_88;
    ApiCase::ApiCase(local_88,context,local_70._M_dataplus._M_p,"SAMPLES and NUM_SAMPLE_COUNTS");
    (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e38558;
    *(undefined4 *)&pAVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = local_7c
    ;
    *(byte *)((long)&pAVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         bVar1 & 1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = local_78 + 0x10;
  }
  pAVar3 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar3,(this->super_TestCaseGroup).m_context,"rgba8_samples_buffer",
                   "SAMPLES bufSize parameter");
  (pAVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e385b0;
  *(undefined4 *)&pAVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8058;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar3);
  return extraout_EAX;
}

Assistant:

void InternalFormatQueryTests::init (void)
{
	const struct InternalFormat
	{
		const char*	name;
		GLenum		format;
		bool		isIntegerFormat;
	} internalFormats[] =
	{
		// color renderable and unsized
		// \note These unsized formats seem to allowed by the spec, but they are not useful in any way. (You can't create a renderbuffer with such internalFormat)
		{ "rgba",					GL_RGBA,				false	},
		{ "rgb",					GL_RGB,					false	},

		// color renderable
		{ "r8",						GL_R8,					false	},
		{ "rg8",					GL_RG8,					false	},
		{ "rgb8",					GL_RGB8,				false	},
		{ "rgb565",					GL_RGB565,				false	},
		{ "rgba4",					GL_RGBA4,				false	},
		{ "rgb5_a1",				GL_RGB5_A1,				false	},
		{ "rgba8",					GL_RGBA8,				false	},
		{ "rgb10_a2",				GL_RGB10_A2,			false	},
		{ "rgb10_a2ui",				GL_RGB10_A2UI,			true	},
		{ "srgb8_alpha8",			GL_SRGB8_ALPHA8,		false	},
		{ "r8i",					GL_R8I,					true	},
		{ "r8ui",					GL_R8UI,				true	},
		{ "r16i",					GL_R16I,				true	},
		{ "r16ui",					GL_R16UI,				true	},
		{ "r32i",					GL_R32I,				true	},
		{ "r32ui",					GL_R32UI,				true	},
		{ "rg8i",					GL_RG8I,				true	},
		{ "rg8ui",					GL_RG8UI,				true	},
		{ "rg16i",					GL_RG16I,				true	},
		{ "rg16ui",					GL_RG16UI,				true	},
		{ "rg32i",					GL_RG32I,				true	},
		{ "rg32ui",					GL_RG32UI,				true	},
		{ "rgba8i",					GL_RGBA8I,				true	},
		{ "rgba8ui",				GL_RGBA8UI,				true	},
		{ "rgba16i",				GL_RGBA16I,				true	},
		{ "rgba16ui",				GL_RGBA16UI,			true	},
		{ "rgba32i",				GL_RGBA32I,				true	},
		{ "rgba32ui",				GL_RGBA32UI,			true	},

		// depth renderable
		{ "depth_component16",		GL_DEPTH_COMPONENT16,	false	},
		{ "depth_component24",		GL_DEPTH_COMPONENT24,	false	},
		{ "depth_component32f",		GL_DEPTH_COMPONENT32F,	false	},
		{ "depth24_stencil8",		GL_DEPTH24_STENCIL8,	false	},
		{ "depth32f_stencil8",		GL_DEPTH32F_STENCIL8,	false	},

		// stencil renderable
		{ "stencil_index8",			GL_STENCIL_INDEX8,		false	}
		// DEPTH24_STENCIL8,  duplicate
		// DEPTH32F_STENCIL8  duplicate
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(internalFormats); ++ndx)
	{
		const InternalFormat internalFormat = internalFormats[ndx];

		addChild(new SamplesCase(m_context, (std::string(internalFormat.name) + "_samples").c_str(), "SAMPLES and NUM_SAMPLE_COUNTS", internalFormat.format, internalFormat.isIntegerFormat));
	}

	addChild(new SamplesBufferSizeCase(m_context, "rgba8_samples_buffer", "SAMPLES bufSize parameter", GL_RGBA8));
}